

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# breadcrumb.c
# Opt level: O0

void push_breadcrumb(CgreenBreadcrumb *breadcrumb,char *name)

{
  void *pvVar1;
  undefined8 in_RSI;
  long *in_RDI;
  char **tmp;
  
  *(int *)(in_RDI + 1) = (int)in_RDI[1] + 1;
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) + 1;
    pvVar1 = realloc((void *)*in_RDI,(long)*(int *)((long)in_RDI + 0xc) << 3);
    if (pvVar1 == (void *)0x0) {
      *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) + -1;
      *(int *)(in_RDI + 1) = (int)in_RDI[1] + -1;
      return;
    }
    *in_RDI = (long)pvVar1;
  }
  *(undefined8 *)(*in_RDI + (long)((int)in_RDI[1] + -1) * 8) = in_RSI;
  return;
}

Assistant:

void push_breadcrumb(CgreenBreadcrumb *breadcrumb, const char *name) {
    breadcrumb->depth++;
    if (breadcrumb->depth > breadcrumb->space) {
        const char **tmp;
        breadcrumb->space++;
        tmp = (const char**) realloc((void*)breadcrumb->trail,
                sizeof(const char *) * breadcrumb->space);
        if (tmp == NULL) {
            breadcrumb->space--;
            breadcrumb->depth--;
            return;
        }
        breadcrumb->trail = tmp;
    }
    breadcrumb->trail[breadcrumb->depth - 1] = name;
}